

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O0

string * namingConventions::correctClassName(string *__return_storage_ptr__,string *name)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  ulong uVar4;
  uint local_20;
  uint c;
  string *name_local;
  string *corrected;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_20 = 0;
  while( true ) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
    iVar1 = isalpha((int)*pcVar2);
    if (iVar1 != 0) break;
    local_20 = local_20 + 1;
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
  iVar1 = islower((int)*pcVar2);
  if (iVar1 != 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
    iVar1 = toupper((int)*pcVar2);
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
    *puVar3 = (char)iVar1;
  }
  do {
    uVar4 = std::__cxx11::string::size();
    if (uVar4 <= local_20) {
      return __return_storage_ptr__;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
    iVar1 = isupper((int)*pcVar2);
    if (iVar1 == 0) {
LAB_0016d0a7:
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      if ((*pcVar2 == '_') &&
         (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar2 == '_')) {
        std::__cxx11::string::erase((ulong)name,(ulong)local_20);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
        iVar1 = isalpha((int)*pcVar2);
        if (iVar1 == 0) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
          iVar1 = isdigit((int)*pcVar2);
          if ((iVar1 == 0) &&
             (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar2 != '_')) {
            std::__cxx11::string::erase((ulong)name,(ulong)local_20);
            goto LAB_0016d1d6;
          }
        }
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      iVar1 = isupper((int)*pcVar2);
      if (iVar1 == 0) goto LAB_0016d0a7;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      iVar1 = _tolower((int)*pcVar2);
      puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)name);
      *puVar3 = (char)iVar1;
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)name);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
LAB_0016d1d6:
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::string namingConventions::correctClassName(std::string name) {
    std::string corrected;
    unsigned int c = 0;
    while (!isalpha(name[c])) {
        c++;
    }
    if (islower(name[c])) {
        name[c] = toupper(name[c]);
    }
    for (; c < name.size(); ++c) {
        if (isupper(name[c]) && isupper(name[c + 1])) {
            name[c + 1] = _tolower(name[c + 1]);
            corrected += name[c];
        } else if (name[c] == '_' && name[c + 1] == '_') {
            name.erase(c, 1);
        } else if (!isalpha(name[c]) && !isdigit(name[c]) &&name[c] != '_') {
            name.erase(c, 1);
        } else {
            corrected += name[c];
        }
    }
    return corrected;

}